

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pong.cpp
# Opt level: O0

void ball_anim_method_proc(Am_Object *param_1)

{
  Am_Slot_Key AVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Am_Value *pAVar5;
  int new_y;
  int new_x;
  Am_Object *param_0_local;
  
  pAVar5 = (Am_Value *)Am_Object::Get(0xa2d0,100);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  uVar3 = iVar2 + x_offset;
  pAVar5 = (Am_Value *)Am_Object::Get(0xa2d0,0x65);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  uVar4 = iVar2 + y_offset;
  if ((int)uVar4 < 1) {
LAB_0010452d:
    y_offset = -y_offset;
  }
  else {
    pAVar5 = (Am_Value *)Am_Object::Get(0xa2b8,0x67);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    if (iVar2 + -0x15 <= (int)uVar4) goto LAB_0010452d;
  }
  if ((int)uVar3 < 0x14) {
    pAVar5 = (Am_Value *)Am_Object::Get(0xa2c0,0x65);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    if (iVar2 <= (int)(uVar4 + 10)) {
      pAVar5 = (Am_Value *)Am_Object::Get(0xa2c0,0x65);
      iVar2 = Am_Value::operator_cast_to_int(pAVar5);
      if ((int)(uVar4 + 10) <= iVar2 + 0x3c) {
        x_offset = -x_offset;
        goto LAB_00104709;
      }
    }
    AVar1 = PLAYER2_SCORE;
    pAVar5 = (Am_Value *)Am_Object::Get(0xa2b0,(ulong)PLAYER2_SCORE);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    Am_Object::Set(0xa2b0,(uint)AVar1,(ulong)(iVar2 + 1));
    reset_game();
    player1sturn = false;
  }
  else {
    pAVar5 = (Am_Value *)Am_Object::Get(0xa2b8,0x66);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    if (iVar2 + -0x14 < (int)(uVar3 + 0x15)) {
      pAVar5 = (Am_Value *)Am_Object::Get(0xa2c8,0x65);
      iVar2 = Am_Value::operator_cast_to_int(pAVar5);
      if (iVar2 <= (int)(uVar4 + 10)) {
        pAVar5 = (Am_Value *)Am_Object::Get(0xa2c8,0x65);
        iVar2 = Am_Value::operator_cast_to_int(pAVar5);
        if ((int)(uVar4 + 10) <= iVar2 + 0x3c) {
          x_offset = -x_offset;
          goto LAB_00104709;
        }
      }
      AVar1 = PLAYER1_SCORE;
      pAVar5 = (Am_Value *)Am_Object::Get(0xa2b0,(ulong)PLAYER1_SCORE);
      iVar2 = Am_Value::operator_cast_to_int(pAVar5);
      Am_Object::Set(0xa2b0,(uint)AVar1,(ulong)(iVar2 + 1));
      reset_game();
      player1sturn = true;
    }
  }
LAB_00104709:
  Am_Object::Set(0xa2d0,100,(ulong)uVar3);
  Am_Object::Set(0xa2d0,0x65,(ulong)uVar4);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, ball_anim_method, (Am_Object /*cmd*/))
{
  int new_x = (int)ball.Get(Am_LEFT) + x_offset;
  int new_y = (int)ball.Get(Am_TOP) + y_offset;
  if (new_y <= 0 || new_y >= (int)main_group.Get(Am_HEIGHT) - ball_size) {
    // y bounce
    y_offset = -y_offset;
  }
  if (new_x < paddle_width + 10) {
    if ((new_y + ball_size / 2) < (int)paddle1.Get(Am_TOP) ||
        (new_y + ball_size / 2) > (int)paddle1.Get(Am_TOP) + paddle_height) {
      //player1 loses
      window.Set(PLAYER2_SCORE, (int)window.Get(PLAYER2_SCORE) + 1);
      reset_game();
      player1sturn = false;
    } else { // bounce off paddle1
      x_offset = -x_offset;
    }
  } else if (new_x + ball_size >
             (int)main_group.Get(Am_WIDTH) - paddle_width - 10) {
    if ((new_y + ball_size / 2) < (int)paddle2.Get(Am_TOP) ||
        (new_y + ball_size / 2) > (int)paddle2.Get(Am_TOP) + paddle_height) {
      //player2 loses
      window.Set(PLAYER1_SCORE, (int)window.Get(PLAYER1_SCORE) + 1);
      reset_game();
      player1sturn = true;
    } else { // bounce off paddle2
      x_offset = -x_offset;
    }
  }
  ball.Set(Am_LEFT, new_x);
  ball.Set(Am_TOP, new_y);
}